

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::completeCacheSave(QNetworkReplyImplPrivate *this)

{
  QAbstractNetworkCache *pQVar1;
  long in_RDI;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffffe8;
  
  if (((*(byte *)(in_RDI + 600) & 1) == 0) || (*(int *)(in_RDI + 0x228) == 0)) {
    if (((*(byte *)(in_RDI + 600) & 1) != 0) && (*(long *)(in_RDI + 0x260) != 0)) {
      pQVar1 = networkCache(in_stack_ffffffffffffffe8);
      (**(code **)(*(long *)pQVar1 + 0x90))(pQVar1,*(undefined8 *)(in_RDI + 0x260));
    }
  }
  else {
    pQVar1 = networkCache(in_stack_ffffffffffffffe8);
    (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,in_RDI + 0x1e0);
  }
  *(undefined8 *)(in_RDI + 0x260) = 0;
  *(undefined1 *)(in_RDI + 600) = 0;
  return;
}

Assistant:

void QNetworkReplyImplPrivate::completeCacheSave()
{
    if (cacheEnabled && errorCode != QNetworkReplyImpl::NoError) {
        networkCache()->remove(url);
    } else if (cacheEnabled && cacheSaveDevice) {
        networkCache()->insert(cacheSaveDevice);
    }
    cacheSaveDevice = nullptr;
    cacheEnabled = false;
}